

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O1

void __thiscall hwnet::TCPSocket::Shutdown(TCPSocket *this)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->mtx);
  if (iVar1 == 0) {
    if (((((this->closed)._M_base._M_i & 1U) == 0) && (this->shutdown == false)) &&
       (this->shutdown = true, this->ptrSendlist->head == (sendContext *)0x0)) {
      shutdown(this->fd,1);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void TCPSocket::Shutdown() {

	std::lock_guard<std::mutex> guard(this->mtx);
	if(this->closed || this->shutdown) {
		return;
	}

	this->shutdown = true;

	if(this->ptrSendlist->empty()){
		::shutdown(this->fd,SHUT_WR);
	}
}